

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::renderPrep(Sandbox *this)

{
  mutex *__mutex;
  string *__lhs;
  UniformFunctionsMap *this_00;
  bool bVar1;
  uint32_t _width;
  uint32_t _height;
  _Base_ptr p_Var2;
  pointer ppFVar3;
  mapped_type *pmVar4;
  socklen_t __len;
  pointer ppFVar5;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  int __fd;
  key_type *__k;
  Uniforms *pUVar6;
  Uniforms *this_01;
  string *_ext;
  long lVar7;
  allocator local_59;
  string local_58;
  ImagesMap *local_38;
  
  if ((this->uniforms).tracker.m_running == true) {
    std::__cxx11::string::string((string *)&local_58,"render",&local_59);
    Tracker::begin(&(this->uniforms).tracker,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  this_01 = &this->uniforms;
  if ((this->m_initialized == true) &&
     (Uniforms::update(this_01),
     (this->uniforms).loadQueue._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_38 = &(this->uniforms).loadQueue;
    __mutex = &(this->uniforms).loadMutex;
    std::mutex::lock(__mutex);
    for (p_Var2 = (this->uniforms).loadQueue._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->uniforms).loadQueue._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      vera::Scene::addTexture
                (&this_01->super_Scene,(string *)(p_Var2 + 1),(Image *)(p_Var2 + 2),true,true);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>_>
    ::clear(&local_38->_M_t);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if (this->m_update_buffers == false) {
    ppFVar3 = (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_buffers_total != (int)((ulong)((long)ppFVar5 - (long)ppFVar3) >> 3)) ||
       (this->m_doubleBuffers_total !=
        (int)((ulong)((long)(this->uniforms).doubleBuffers.
                            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->uniforms).doubleBuffers.
                           super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3))) goto LAB_001def22;
  }
  else {
LAB_001def22:
    _updateBuffers(this);
    ppFVar3 = (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((((ppFVar5 != ppFVar3) ||
       ((this->uniforms).doubleBuffers.
        super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->uniforms).doubleBuffers.
        super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
        super__Vector_impl_data._M_start)) || (0 < this->m_pyramid_total)) ||
     (0 < this->m_flood_total)) {
    _renderBuffers(this);
  }
  __len = (socklen_t)ppFVar5;
  if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    SceneRender::renderShadowMap(&this->m_sceneRender,this_01);
  }
  __lhs = &this->screenshotFile;
  bVar1 = std::operator!=(__lhs,"");
  if (((bVar1) || (bVar1 = isRecording(), bVar1)) && ((this->m_record_fbo).m_allocated == false)) {
    _width = vera::getWindowWidth();
    _height = vera::getWindowHeight();
    __len = 1;
    vera::Fbo::allocate(&this->m_record_fbo,_width,_height,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,REPEAT,
                        true);
  }
  std::__cxx11::string::string((string *)&local_58,"u_sceneNormal",&local_59);
  this_00 = &(this->uniforms).functions;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_58);
  bVar1 = pmVar4->present;
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1 == true) {
    SceneRender::renderNormalBuffer(&this->m_sceneRender,this_01);
  }
  std::__cxx11::string::string((string *)&local_58,"u_scenePosition",&local_59);
  __k = &local_58;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,__k);
  __fd = (int)__k;
  bVar1 = pmVar4->present;
  std::__cxx11::string::~string((string *)&local_58);
  __addr = extraout_RDX;
  if (bVar1 == true) {
    pUVar6 = this_01;
    SceneRender::renderPositionBuffer(&this->m_sceneRender,this_01);
    __fd = (int)pUVar6;
    __addr = extraout_RDX_00;
  }
  if ((this->m_sceneRender).m_buffers_total != 0) {
    SceneRender::renderBuffers(&this->m_sceneRender,this_01);
    __fd = (int)this_01;
    __addr = extraout_RDX_01;
  }
  lVar7 = 0x8a0;
  if ((this->m_postprocessing == false) && (4 < this->m_plot - PLOT_LUMA)) {
    __fd = 0x2f9c3e;
    bVar1 = std::operator!=(__lhs,"");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_58,"png",&local_59);
      _ext = &local_58;
      bVar1 = vera::haveExt(__lhs,_ext);
      __fd = (int)_ext;
      std::__cxx11::string::~string((string *)&local_58);
      lVar7 = 0x2660;
      __addr = extraout_RDX_02;
      if (bVar1) {
        glEnable(0xbe2);
        __fd = 0x303;
        glBlendFunc(1);
        __addr = extraout_RDX_03;
      }
    }
    else {
      lVar7 = 0x2660;
      bVar1 = isRecording();
      __addr = extraout_RDX_04;
      if (!bVar1) goto LAB_001df090;
    }
  }
  vera::Fbo::bind((Fbo *)((long)&this->_vptr_Sandbox + lVar7),__fd,__addr,__len);
LAB_001df090:
  glClear(0x4100);
  return;
}

Assistant:

void Sandbox::renderPrep() {
    TRACK_BEGIN("render")

    // UPDATE STREAMING TEXTURES
    // -----------------------------------------------
    if (m_initialized) {
        uniforms.update();
        if (uniforms.loadQueue.size() > 0) {
            uniforms.loadMutex.lock();
            for (ImagesMap::iterator it = uniforms.loadQueue.begin(); it != uniforms.loadQueue.end(); ++it)
                uniforms.addTexture( it->first, it->second );
            uniforms.loadQueue.clear();
            uniforms.loadMutex.unlock();
        }
    }

    // BUFFERS
    // -----------------------------------------------
    if (m_update_buffers ||
        m_buffers_total != int(uniforms.buffers.size()) ||
        m_doubleBuffers_total != int(uniforms.doubleBuffers.size()) )
        _updateBuffers();
    
    if (uniforms.buffers.size() > 0 || 
        uniforms.doubleBuffers.size() > 0 ||
        m_pyramid_total > 0 ||
        m_flood_total > 0)
        _renderBuffers();

    // RENDER SHADOW MAP
    // -----------------------------------------------
    if (uniforms.models.size() > 0)
        m_sceneRender.renderShadowMap(uniforms);
    
    // MAIN SCENE
    // ----------------------------------------------- < main scene start
    if (screenshotFile != "" || isRecording() )
        if (!m_record_fbo.isAllocated())
            m_record_fbo.allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::COLOR_TEXTURE_DEPTH_BUFFER);

    if (uniforms.functions["u_sceneNormal"].present)
        m_sceneRender.renderNormalBuffer(uniforms);

    if (uniforms.functions["u_scenePosition"].present)
        m_sceneRender.renderPositionBuffer(uniforms);

    if (m_sceneRender.getBuffersTotal() != 0)
        m_sceneRender.renderBuffers(uniforms);

    if (m_postprocessing || m_plot == PLOT_LUMA || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE ) {
        m_sceneRender.renderFbo.bind();
    }
    else if (screenshotFile != "") {
        if (vera::haveExt(screenshotFile, "png")) {
            glEnable(GL_BLEND);
            glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
        }
        m_record_fbo.bind();
    }
    else if (isRecording())
        m_record_fbo.bind();

    // Clear the background
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
}